

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O3

int32_t helicsDataBufferFillFromNamedPoint(HelicsDataBuffer data,char *name,double val)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Message *pMVar2;
  size_t sVar3;
  SmallBuffer *ptr;
  _Alloc_hider _Var4;
  NamedPoint local_40;
  
  if ((data == (HelicsDataBuffer)0x0) || (*(int *)((long)data + 0x5c) != 0x24ea663f)) {
    pMVar2 = getMessageObj(data,(HelicsError *)0x0);
    if (pMVar2 == (Message *)0x0) {
      return 0;
    }
    data = &pMVar2->data;
  }
  sVar3 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
  _Var4._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
  if (name != (char *)0x0) {
    sVar3 = strlen(name);
    _Var4._M_p = name;
  }
  paVar1 = &local_40.name.field_2;
  local_40.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,_Var4._M_p,_Var4._M_p + sVar3)
  ;
  local_40.value = val;
  helics::SmallBuffer::reserve((SmallBuffer *)data,local_40.name._M_string_length + 0x10);
  ((SmallBuffer *)data)->bufferSize = local_40.name._M_string_length + 0x10;
  helics::detail::convertToBinary(((SmallBuffer *)data)->heap,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.name._M_dataplus._M_p,local_40.name.field_2._M_allocated_capacity + 1);
  }
  return (int32_t)((SmallBuffer *)data)->bufferSize;
}

Assistant:

int32_t helicsDataBufferFillFromNamedPoint(HelicsDataBuffer data, const char* name, double val)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return 0;
    }
    try {
        helics::ValueConverter<helics::NamedPoint>::convert(helics::NamedPoint(AS_STRING_VIEW(name), val), *ptr);
        return static_cast<int32_t>(ptr->size());
    }
    catch (const std::bad_alloc&) {
        return 0;
    }
}